

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_udmf.cpp
# Opt level: O2

void __thiscall UDMFParser::ProcessLineDefs(UDMFParser *this)

{
  double *pdVar1;
  TArray<line_t,_line_t> *this_00;
  double dVar2;
  vertex_t *pvVar3;
  vertex_t *pvVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  UDMFParser *pUVar7;
  int iVar8;
  line_t *plVar9;
  ulong uVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  uint uVar14;
  short *psVar15;
  DWORD *pDVar16;
  DWORD *pDVar17;
  uint uVar18;
  long lVar19;
  uint i;
  uint index;
  bool bVar20;
  byte bVar21;
  int local_84;
  short tempalpha [2];
  uint local_64;
  UDMFParser *local_60;
  long local_58;
  long local_50;
  long local_48;
  long local_40;
  short *local_38;
  
  bVar21 = 0;
  this_00 = &this->ParsedLines;
  iVar11 = 0;
  uVar10 = 0;
  local_84 = 0;
  local_60 = this;
  do {
    while( true ) {
      index = (uint)uVar10;
      uVar18 = index + iVar11;
      while( true ) {
        uVar14 = (local_60->ParsedLines).Count;
        if (uVar14 <= index) {
          numsides = local_84;
          auVar5._8_8_ = 0;
          auVar5._0_8_ = (long)(int)uVar14;
          uVar10 = SUB168(auVar5 * ZEXT816(0x98),0);
          if (SUB168(auVar5 * ZEXT816(0x98),8) != 0) {
            uVar10 = 0xffffffffffffffff;
          }
          numlines = uVar14;
          lines = (line_t *)operator_new__(uVar10);
          auVar6._8_8_ = 0;
          auVar6._0_8_ = (long)local_84;
          uVar10 = 0xffffffffffffffff;
          if (SUB168(auVar6 * ZEXT816(0xd8),8) == 0) {
            uVar10 = SUB168(auVar6 * ZEXT816(0xd8),0);
          }
          sides = (side_t *)operator_new__(uVar10);
          pUVar7 = local_60;
          lVar19 = 0x48;
          iVar11 = 0;
          lVar13 = 0;
          while (lVar13 < (int)uVar14) {
            tempalpha[0] = -0x8000;
            tempalpha[1] = -0x8000;
            local_58 = lVar13 * 0x98;
            plVar9 = this_00->Array + lVar13;
            pvVar3 = plVar9->v2;
            pDVar17 = &lines[lVar13].flags;
            ((line_t *)(pDVar17 + -8))->v1 = plVar9->v1;
            *(vertex_t **)(pDVar17 + -6) = pvVar3;
            dVar2 = (plVar9->delta).Y;
            ((DVector2 *)(pDVar17 + -4))->X = (plVar9->delta).X;
            *(double *)(pDVar17 + -2) = dVar2;
            pDVar16 = &plVar9->flags;
            for (lVar12 = 0xf; lVar12 != 0; lVar12 = lVar12 + -1) {
              *(undefined8 *)pDVar17 = *(undefined8 *)pDVar16;
              pDVar16 = pDVar16 + ((ulong)bVar21 * -2 + 1) * 2;
              pDVar17 = pDVar17 + (ulong)bVar21 * -4 + 2;
            }
            psVar15 = tempalpha;
            lVar12 = 2;
            local_50 = lVar19;
            local_48 = lVar13;
            while (lVar13 = local_58, bVar20 = lVar12 != 0, lVar12 = lVar12 + -1, bVar20) {
              lVar13 = *(long *)((long)lines->args + lVar19 + -0x2c);
              if (lVar13 != 0) {
                iVar8 = (int)lVar13;
                if (local_84 < iVar8) {
                  *(undefined8 *)((long)lines->args + lVar19 + -0x2c) = 0;
                }
                else {
                  local_40 = (long)(iVar8 + -1);
                  local_38 = psVar15;
                  memcpy(sides + iVar11,(pUVar7->ParsedSides).Array + local_40,0xd4);
                  psVar15 = local_38;
                  sides[iVar11].linedef = (line_t *)((long)lines->args + local_58 + -0x2c);
                  sides[iVar11].sector = sectors + (long)sides[iVar11].sector;
                  *(side_t **)((long)lines->args + lVar19 + -0x2c) = sides + iVar11;
                  P_ProcessSideTextures
                            ((bool)(pUVar7->isExtended ^ 1),sides + iVar11,sides[iVar11].sector,
                             (pUVar7->ParsedSideTextures).Array + local_40,
                             *(int *)((long)lines->args + local_58 + -4),
                             *(int *)((long)lines->args + local_58),local_38,pUVar7->missingTex);
                  iVar11 = iVar11 + 1;
                }
              }
              psVar15 = psVar15 + 1;
              lVar19 = lVar19 + 8;
            }
            P_AdjustLine((line_t *)((long)lines->args + local_58 + -0x2c));
            P_FinishLoadingLineDef((line_t *)((long)lines->args + lVar13 + -0x2c),(int)tempalpha[0])
            ;
            lVar19 = local_50 + 0x98;
            uVar14 = numlines;
            lVar13 = local_48 + 1;
          }
          if (numsides < iVar11) {
            __assert_fail("side <= numsides",
                          "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_udmf.cpp"
                          ,0x6ec,"void UDMFParser::ProcessLineDefs()");
          }
          if (iVar11 < numsides) {
            Printf("Map had %d invalid side references\n");
            numsides = iVar11;
          }
          return;
        }
        plVar9 = this_00->Array;
        pvVar3 = plVar9[uVar10].v1;
        pvVar4 = plVar9[uVar10].v2;
        if (((long)pvVar3 < (long)numvertexes) &&
           (-1 < (long)((ulong)pvVar3 | (ulong)pvVar4) && (long)pvVar4 < (long)numvertexes)) break;
        I_Error("Line %d has invalid vertices: %zd and/or %zd.\nThe map only contains %d vertices.",
                (ulong)uVar18);
      }
      if (pvVar3 == pvVar4) break;
      dVar2 = vertexes[(long)pvVar3].p.X;
      if ((dVar2 == vertexes[(long)pvVar4].p.X) && (!NAN(dVar2) && !NAN(vertexes[(long)pvVar4].p.X))
         ) {
        dVar2 = vertexes[(long)pvVar3].p.Y;
        pdVar1 = &vertexes[(long)pvVar4].p.Y;
        if ((dVar2 == *pdVar1) && (!NAN(dVar2) && !NAN(*pdVar1))) break;
      }
      plVar9 = plVar9 + uVar10;
      plVar9->v1 = vertexes + (long)pvVar3;
      plVar9->v2 = vertexes + (long)pvVar4;
      local_84 = ((local_84 - (uint)(plVar9->sidedef[0] == (side_t *)0x0)) + 2) -
                 (uint)(plVar9->sidedef[1] == (side_t *)0x0);
      local_64 = uVar18;
      TArray<int,_int>::Push(&linemap,(int *)&local_64);
      uVar10 = (ulong)(index + 1);
    }
    Printf("Removing 0-length line %d\n",(ulong)uVar18);
    TArray<line_t,_line_t>::Delete(this_00,index);
    ForceNodeBuild = true;
    iVar11 = iVar11 + 1;
  } while( true );
}

Assistant:

void ProcessLineDefs()
	{
		int sidecount = 0;
		for(unsigned i = 0, skipped = 0; i < ParsedLines.Size();)
		{
			// Relocate the vertices
			intptr_t v1i = intptr_t(ParsedLines[i].v1);
			intptr_t v2i = intptr_t(ParsedLines[i].v2);

			if (v1i >= numvertexes || v2i >= numvertexes || v1i < 0 || v2i < 0)
			{
				I_Error ("Line %d has invalid vertices: %zd and/or %zd.\nThe map only contains %d vertices.", i+skipped, v1i, v2i, numvertexes);
			}
			else if (v1i == v2i ||
				(vertexes[v1i].fX() == vertexes[v2i].fX() && vertexes[v1i].fY() == vertexes[v2i].fY()))
			{
				Printf ("Removing 0-length line %d\n", i+skipped);
				ParsedLines.Delete(i);
				ForceNodeBuild = true;
				skipped++;
			}
			else
			{
				ParsedLines[i].v1 = &vertexes[v1i];
				ParsedLines[i].v2 = &vertexes[v2i];

				if (ParsedLines[i].sidedef[0] != NULL)
					sidecount++;
				if (ParsedLines[i].sidedef[1] != NULL)
					sidecount++;
				linemap.Push(i+skipped);
				i++;
			}
		}
		numlines = ParsedLines.Size();
		numsides = sidecount;
		lines = new line_t[numlines];
		sides = new side_t[numsides];
		int line, side;

		for(line = 0, side = 0; line < numlines; line++)
		{
			short tempalpha[2] = { SHRT_MIN, SHRT_MIN };

			lines[line] = ParsedLines[line];

			for(int sd = 0; sd < 2; sd++)
			{
				if (lines[line].sidedef[sd] != NULL)
				{
					int mapside = int(intptr_t(lines[line].sidedef[sd]))-1;
					if (mapside < sidecount)
					{
						sides[side] = ParsedSides[mapside];
						sides[side].linedef = &lines[line];
						sides[side].sector = &sectors[intptr_t(sides[side].sector)];
						lines[line].sidedef[sd] = &sides[side];

						P_ProcessSideTextures(!isExtended, &sides[side], sides[side].sector, &ParsedSideTextures[mapside],
							lines[line].special, lines[line].args[0], &tempalpha[sd], missingTex);

						side++;
					}
					else
					{
						lines[line].sidedef[sd] = NULL;
					}
				}
			}

			P_AdjustLine(&lines[line]);
			P_FinishLoadingLineDef(&lines[line], tempalpha[0]);
		}
		assert(side <= numsides);
		if (side < numsides)
		{
			Printf("Map had %d invalid side references\n", numsides - side);
			numsides = side;
		}
	}